

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyItemNum(Scl_Tree_t *p,Scl_Item_t *pRoot,char *pName)

{
  uint uVar1;
  Scl_Item_t *pSVar2;
  int iVar3;
  int *piVar4;
  
  piVar4 = &pRoot->Child;
  iVar3 = 0;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) break;
    uVar1 = Scl_LibertyCompare(p,pSVar2->Key,pName);
    iVar3 = iVar3 + (uVar1 ^ 1);
    piVar4 = &pSVar2->Next;
  }
  return iVar3;
}

Assistant:

int Scl_LibertyItemNum( Scl_Tree_t * p, Scl_Item_t * pRoot, char * pName )
{
    Scl_Item_t * pItem;
    int Counter = 0;
    Scl_ItemForEachChildName( p, pRoot, pItem, pName )
        Counter++;
    return Counter;
}